

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O3

int NeedWriter(FFSArrayRequest_conflict Req,int i)

{
  FFSVarRec_conflict pFVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  
  pFVar1 = Req->VarRec;
  if (Req->RequestType == Local) {
    if (pFVar1->PerWriterBlockStart[i] <= Req->BlockID) {
      return (uint)(Req->BlockID <=
                   (pFVar1->PerWriterBlockStart[i] + pFVar1->PerWriterBlockCount[i]) - 1);
    }
  }
  else {
    if (pFVar1->DimCount == 0) {
      return 1;
    }
    if (pFVar1->PerWriterStart[i] != (size_t *)0x0) {
      sVar4 = 0;
      while ((Req->Count[sVar4] != 0 && (pFVar1->PerWriterCounts[i][sVar4] != 0))) {
        uVar2 = Req->Start[sVar4];
        uVar3 = pFVar1->PerWriterStart[i][sVar4];
        if (pFVar1->PerWriterCounts[i][sVar4] + uVar3 <= uVar2 && uVar3 < uVar2) {
          return 0;
        }
        if (Req->Count[sVar4] + uVar2 <= uVar3) {
          return 0;
        }
        sVar4 = sVar4 + 1;
        if (pFVar1->DimCount == sVar4) {
          return 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int NeedWriter(FFSArrayRequest Req, int i)
{
    if (Req->RequestType == Local)
    {
        size_t NodeFirst = Req->VarRec->PerWriterBlockStart[i];
        size_t NodeLast = Req->VarRec->PerWriterBlockCount[i] + NodeFirst - 1;
        return (NodeFirst <= Req->BlockID) && (NodeLast >= Req->BlockID);
    }
    // else Global case
    for (int j = 0; j < Req->VarRec->DimCount; j++)
    {
        size_t SelOffset = Req->Start[j];
        size_t SelSize = Req->Count[j];
        size_t RankOffset;
        size_t RankSize;
        if (Req->VarRec->PerWriterStart[i] == NULL)
        /* this writer didn't write */
        {
            return 0;
        }
        RankOffset = Req->VarRec->PerWriterStart[i][j];
        RankSize = Req->VarRec->PerWriterCounts[i][j];
        if ((SelSize == 0) || (RankSize == 0))
        {
            return 0;
        }
        if ((RankOffset < SelOffset && (RankOffset + RankSize) <= SelOffset) ||
            (RankOffset >= SelOffset + SelSize))
        {
            return 0;
        }
    }
    return 1;
}